

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

void cb(Fl_Widget *param_1,void *v)

{
  Fl_Type *this;
  int iVar1;
  int iVar2;
  Fl_Type *o;
  undefined4 extraout_var;
  int h;
  int w;
  Fl_Color c;
  int s;
  Fl_Font f;
  
  undo_checkpoint();
  undo_suspend();
  o = (Fl_Type *)(**(code **)(*v + 0x18))(v);
  if (o == (Fl_Type *)0x0) {
    undo_current = undo_current + -1;
    undo_last = undo_last + -1;
  }
  else {
    iVar1 = (*o->_vptr_Fl_Type[0x17])(o);
    if (iVar1 != 0) {
      iVar2 = (*o->_vptr_Fl_Type[0x21])(o);
      iVar1 = Fl_Widget_Type::default_size;
      if (iVar2 == 0) {
        *(int *)&(o[1].prev)->field_0x4c = Fl_Widget_Type::default_size;
        s = iVar1;
        (*o->_vptr_Fl_Type[0x2b])(o,2,&f,&s,&c);
        w = 0;
        h = 0;
        (*o->_vptr_Fl_Type[0x2d])(o,&w,&h);
        iVar1 = (*o->_vptr_Fl_Type[5])(o);
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Fl_Menu_Bar");
        this = o[1].prev;
        if (iVar1 == 0) {
          (*this->_vptr_Fl_Type[4])(this,0,0);
        }
        else {
          Fl_Widget::size((Fl_Widget *)this,w,h);
        }
      }
    }
    select_only(o);
    set_modflag(1);
    (*o->_vptr_Fl_Type[0xb])(o);
  }
  undo_resume();
  return;
}

Assistant:

static void cb(Fl_Widget *, void *v) {
  undo_checkpoint();
  undo_suspend();
  Fl_Type *t = ((Fl_Type*)v)->make();
  if (t) {
    if (t->is_widget() && !t->is_window()) {
      Fl_Widget_Type *wt = (Fl_Widget_Type *)t;

      // Set font sizes...
      wt->o->labelsize(Fl_Widget_Type::default_size);

      Fl_Font f;
      int s = Fl_Widget_Type::default_size;
      Fl_Color c;

      wt->textstuff(2, f, s, c);

      // Resize and/or reposition new widget...
      int w = 0, h = 0;
      wt->ideal_size(w, h);

      if (!strcmp(wt->type_name(), "Fl_Menu_Bar")) {
        // Move and resize the menubar across the top of the window...
        wt->o->resize(0, 0, w, h);
      } else {
        // Just resize to the ideal size...
        wt->o->size(w, h);
      }
    }
    select_only(t);
    set_modflag(1);
    t->open();
  } else {
    undo_current --;
    undo_last --;
  }
  undo_resume();
}